

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O2

_Bool borg_has_mutiple(borg_item_conflict *in_item)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  borg_item_conflict *pbVar4;
  ulong uVar5;
  bool bVar6;
  _Bool _Var7;
  
  _Var7 = true;
  if (in_item->iqty < 2) {
    if (((in_item->ident == false) && (bVar1 = in_item->tval - 2, bVar1 < 0x10)) &&
       ((0xdfffU >> (bVar1 & 0x1f) & 1) != 0)) {
      return false;
    }
    uVar2 = (ulong)z_info->pack_size;
    pbVar4 = borg_items;
    uVar5 = uVar2;
    while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
      if (((pbVar4 != in_item) && (pbVar4->tval == in_item->tval)) &&
         ((pbVar4->sval == in_item->sval && (pbVar4->iqty != '\0')))) {
        return true;
      }
      pbVar4 = pbVar4 + 1;
    }
    for (lVar3 = 100;
        (_Var7 = lVar3 != 0x2ac4, _Var7 &&
        (((borg_items[uVar2].desc[lVar3 + -4] != in_item->tval ||
          (borg_items[uVar2].desc[lVar3 + -3] != in_item->sval)) ||
         (borg_items[uVar2].desc[lVar3] == '\0')))); lVar3 = lVar3 + 0x388) {
    }
  }
  return _Var7;
}

Assistant:

static bool borg_has_mutiple(borg_item *in_item)
{
    int i;
    if (in_item->iqty > 1)
        return true;

    /* Some types of items we only want to count as a dupe in a stack */
    /* for example two unIDd swords may look the same (both rapiers) */
    /* but have different powers */
    if (!in_item->ident) {
        switch (in_item->tval) {
        case TV_BOOTS:
        case TV_GLOVES:
        case TV_HELM:
        case TV_CROWN:
        case TV_SHIELD:
        case TV_SOFT_ARMOR:
        case TV_HARD_ARMOR:
        case TV_SHOT:
        case TV_BOLT:
        case TV_ARROW:
        case TV_BOW:
        case TV_DIGGING:
        case TV_HAFTED:
        case TV_POLEARM:
        case TV_SWORD:
           return false;
        }
    }

    /* check the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];
        if (item == in_item)
            continue;
        if (item->tval == in_item->tval 
            && item->sval == in_item->sval
            && item->iqty != 0)
            return true;
    }

    /* check equipment */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];
        if (item->tval == in_item->tval
            && item->sval == in_item->sval
            && item->iqty != 0)
            return true;
    }
    return false;
}